

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

void __thiscall
flatbuffers::go::GoGenerator::EnumValueMember
          (GoGenerator *this,EnumDef *enum_def,EnumVal *ev,size_t max_name_length,string *code_ptr)

{
  string *psVar1;
  long lVar2;
  string local_90;
  allocator<char> local_59;
  string local_58 [32];
  string *local_38;
  string *code;
  string *code_ptr_local;
  size_t max_name_length_local;
  EnumVal *ev_local;
  EnumDef *enum_def_local;
  GoGenerator *this_local;
  
  local_38 = code_ptr;
  code = code_ptr;
  code_ptr_local = (string *)max_name_length;
  max_name_length_local = (size_t)ev;
  ev_local = (EnumVal *)enum_def;
  enum_def_local = (EnumDef *)this;
  std::__cxx11::string::operator+=((string *)code_ptr,"\t\"");
  std::__cxx11::string::operator+=((string *)local_38,(string *)max_name_length_local);
  std::__cxx11::string::operator+=((string *)local_38,"\": ");
  psVar1 = code_ptr_local;
  lVar2 = std::__cxx11::string::length();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,(long)psVar1 - lVar2,' ',&local_59);
  std::__cxx11::string::operator+=((string *)local_38,local_58);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  IdlNamer::EnumVariant_abi_cxx11_
            (&local_90,&this->namer_,(EnumDef *)ev_local,(EnumVal *)max_name_length_local);
  std::__cxx11::string::operator+=((string *)local_38,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::operator+=((string *)local_38,",\n");
  return;
}

Assistant:

void EnumValueMember(const EnumDef &enum_def, const EnumVal &ev,
                       size_t max_name_length, std::string *code_ptr) {
    std::string &code = *code_ptr;
    code += "\t\"";
    code += ev.name;
    code += "\": ";
    code += std::string(max_name_length - ev.name.length(), ' ');
    code += namer_.EnumVariant(enum_def, ev);
    code += ",\n";
  }